

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSTypeDefinition.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::XSTypeDefinition::derivedFrom(XSTypeDefinition *this,XMLCh *typeNamespace,XMLCh *name)

{
  int iVar1;
  XSTypeDefinition *pXVar2;
  
  if (name != (XMLCh *)0x0) {
    pXVar2 = XSModel::getTypeDefinition((this->super_XSObject).fXSModel,name,typeNamespace);
    if (pXVar2 != (XSTypeDefinition *)0x0) {
      iVar1 = (*(this->super_XSObject)._vptr_XSObject[8])(this,pXVar2);
      return SUB41(iVar1,0);
    }
  }
  return false;
}

Assistant:

bool XSTypeDefinition::derivedFrom(const XMLCh *typeNamespace, 
                                   const XMLCh *name)
{    
    if (!name)
        return false;

    XSTypeDefinition* type = fXSModel->getTypeDefinition(name, typeNamespace);
    
    if (!type)
        return false;

    return derivedFromType(type);
}